

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O2

RK_S32 mpi_enc_opt_g(void *ctx,char *next)

{
  int iVar1;
  
  if ((next != (char *)0x0) &&
     (iVar1 = __isoc99_sscanf(next,"%d:%d:%d",(long)ctx + 0x94,(long)ctx + 0x98,(long)ctx + 0x9c),
     iVar1 != 0)) {
    return 1;
  }
  _mpp_log_l(2,"mpi_enc_utils","invalid gop mode use -g gop_mode:gop_len:vi_len\n",0);
  return 0;
}

Assistant:

RK_S32 mpi_enc_opt_g(void *ctx, const char *next)
{
    MpiEncTestArgs *cmd = (MpiEncTestArgs *)ctx;
    RK_S32 cnt = 0;

    if (next) {
        cnt = sscanf(next, "%d:%d:%d",
                     &cmd->gop_mode, &cmd->gop_len, &cmd->vi_len);
        if (cnt)
            return 1;
    }

    mpp_err("invalid gop mode use -g gop_mode:gop_len:vi_len\n");
    return 0;
}